

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_context.cpp
# Opt level: O1

unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
__thiscall
duckdb::ClientContext::PendingQuery
          (ClientContext *this,string *query,case_insensitive_map_t<BoundParameterData> *values,
          bool allow_stream_result)

{
  type pCVar1;
  reference pvVar2;
  InvalidInputException *pIVar3;
  undefined7 in_register_00000009;
  unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>,_true> lock;
  vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_true>
  statements;
  ErrorData error;
  undefined1 local_d8 [8];
  undefined1 local_d0 [16];
  element_type *local_c0;
  string local_b0 [4];
  
  LockContext((ClientContext *)local_d0);
  pCVar1 = unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>,_true>
           ::operator*((unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>,_true>
                        *)local_d0);
  CleanupInternal((ClientContext *)query,pCVar1,(BaseQueryResult *)0x0,false);
  LOCK();
  *(undefined1 *)&query[1]._M_dataplus._M_p = 0;
  UNLOCK();
  pCVar1 = unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>,_true>
           ::operator*((unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>,_true>
                        *)local_d0);
  ParseStatementsInternal
            ((vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_true>
              *)(local_d0 + 8),(ClientContext *)query,pCVar1,(string *)values);
  if ((element_type *)local_d0._8_8_ == local_c0) {
    pIVar3 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    local_b0[0]._M_dataplus._M_p = (pointer)&local_b0[0].field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_b0,"No statement to prepare!","");
    InvalidInputException::InvalidInputException(pIVar3,local_b0);
    __cxa_throw(pIVar3,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if ((ulong)((long)local_c0 - local_d0._8_8_) < 9) {
    local_b0[0]._M_dataplus._M_p = (pointer)CONCAT71(in_register_00000009,allow_stream_result);
    pCVar1 = unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>,_true>
             ::operator*((unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>,_true>
                          *)local_d0);
    pvVar2 = vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_true>
             ::operator[]((vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_true>
                           *)(local_d0 + 8),0);
    local_d8 = (undefined1  [8])
               (pvVar2->
               super_unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>).
               _M_t.
               super___uniq_ptr_impl<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>
               .super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl;
    (pvVar2->super_unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>).
    _M_t.super___uniq_ptr_impl<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>.
    _M_t.super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>.
    super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl = (SQLStatement *)0x0;
    PendingQueryInternal
              (this,(ClientContextLock *)query,
               (unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true> *)
               pCVar1,(PendingQueryParameters *)local_d8,SUB81(local_b0,0));
    if (local_d8 != (undefined1  [8])0x0) {
      (*(code *)((_Hashtable *)local_d8)->_M_buckets[1])();
    }
    local_d8 = (undefined1  [8])0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
               *)(local_d0 + 8));
    ::std::unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>_>::
    ~unique_ptr((unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>_>
                 *)local_d0);
    return (unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>_>
           )(unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>_>
             )this;
  }
  pIVar3 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  local_b0[0]._M_dataplus._M_p = (pointer)&local_b0[0].field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b0,"Cannot prepare multiple statements at once!","");
  InvalidInputException::InvalidInputException(pIVar3,local_b0);
  __cxa_throw(pIVar3,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

unique_ptr<PendingQueryResult> ClientContext::PendingQuery(const string &query,
                                                           case_insensitive_map_t<BoundParameterData> &values,
                                                           bool allow_stream_result) {
	auto lock = LockContext();
	try {
		InitialCleanup(*lock);

		auto statements = ParseStatementsInternal(*lock, query);
		if (statements.empty()) {
			throw InvalidInputException("No statement to prepare!");
		}
		if (statements.size() > 1) {
			throw InvalidInputException("Cannot prepare multiple statements at once!");
		}

		PendingQueryParameters params;
		params.allow_stream_result = allow_stream_result;
		params.parameters = values;

		return PendingQueryInternal(*lock, std::move(statements[0]), params, true);
	} catch (std::exception &ex) {
		ErrorData error(ex);
		ProcessError(error, query);
		return make_uniq<PendingQueryResult>(std::move(error));
	}
}